

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int server_handle_certificate(ptls_t *tls,ptls_iovec_t message)

{
  ptls_key_schedule_t *ppVar1;
  int iVar2;
  undefined8 in_RAX;
  size_t sVar3;
  uint8_t *puVar4;
  ptls_hash_context_t **pppVar5;
  int got_certs;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  puVar4 = message.base;
  iVar2 = handle_certificate(tls,puVar4 + 4,puVar4 + message.len,&local_34);
  if (iVar2 == 0) {
    if (local_34 == 0) {
      iVar2 = 0x74;
    }
    else {
      ppVar1 = tls->key_schedule;
      if (ppVar1->num_hashes != 0) {
        pppVar5 = &ppVar1->hashes[0].ctx;
        sVar3 = 0;
        do {
          (*(*pppVar5)->update)(*pppVar5,puVar4,message.len);
          sVar3 = sVar3 + 1;
          pppVar5 = pppVar5 + 2;
        } while (sVar3 != ppVar1->num_hashes);
      }
      tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY;
      iVar2 = 0x202;
    }
  }
  return iVar2;
}

Assistant:

static int server_handle_certificate(ptls_t *tls, ptls_iovec_t message)
{
    int got_certs, ret;

    if ((ret = handle_certificate(tls, message.base + PTLS_HANDSHAKE_HEADER_SIZE, message.base + message.len, &got_certs)) != 0)
        return ret;
    if (!got_certs)
        return PTLS_ALERT_CERTIFICATE_REQUIRED;

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

    tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY;
    return PTLS_ERROR_IN_PROGRESS;
}